

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O2

bool __thiscall NaPetriNet::prepare(NaPetriNet *this,bool bDoPrintouts)

{
  NaPNodePtrAr *pNVar1;
  NaPetriNode *pNVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  FILE *pFVar10;
  NaDataFile *pNVar11;
  char *__s;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar12;
  undefined4 extraout_var_04;
  NaPetriConnector *pNVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  int iCn;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  sigaction sa_old;
  sigaction sa;
  
  bVar16 = bDoPrintouts | this->bPrepPrintout;
  if ((FILE *)this->fpDig != (FILE *)0x0) {
    fwrite("}\n",2,1,(FILE *)this->fpDig);
    fclose((FILE *)this->fpDig);
    this->fpDig = (FILE *)0x0;
  }
  if (this->bMapPrintout == true) {
    pcVar12 = this->szName;
    sVar8 = strlen(pcVar12);
    pcVar9 = (char *)operator_new__(sVar8 + 5);
    sprintf(pcVar9,"%s.map",pcVar12);
    pFVar10 = fopen(pcVar9,"wt");
    this->fpMap = (FILE *)pFVar10;
    if (pFVar10 == (FILE *)0x0) {
      NaPrintLog("Failed to write activation map\n");
    }
    else {
      NaPrintLog("Activation map will be put to \'%s\'\n",pcVar9);
    }
    operator_delete__(pcVar9);
  }
  if (bVar16 != 0) {
    NaPrintLog("# net \'%s\', phase #0: preparation.\n",this->szName);
  }
  this->iPrevIndex = -1;
  this->dfTimeChart = (NaDataFile *)0x0;
  if (this->bTimeChart == true) {
    pcVar12 = this->szName;
    sVar8 = strlen(pcVar12);
    pcVar9 = (char *)operator_new__(sVar8 + 5);
    sprintf(pcVar9,"%s.grf",pcVar12);
    if (bVar16 != 0) {
      NaPrintLog("Time chart is on -> %s.\n");
    }
    pNVar11 = OpenOutputDataFile(pcVar9,bdtAuto,0);
    this->dfTimeChart = pNVar11;
    if (pNVar11 == (NaDataFile *)0x0) {
      NaPrintLog("time chart file opening failed.\n");
    }
    else {
      pcVar12 = this->szName;
      sVar8 = strlen(pcVar12);
      __s = (char *)operator_new__(sVar8 + 0x21);
      sprintf(__s,"Time chart for petri network \'%s\'",pcVar12);
      (*this->dfTimeChart->_vptr_NaDataFile[9])(this->dfTimeChart,0,"*TIME*");
      operator_delete__(__s);
    }
    operator_delete__(pcVar9);
  }
  pNVar1 = &this->pnaNet;
  uVar14 = 0;
  while (uVar15 = uVar14, (int)uVar15 < (this->pnaNet).nItems) {
    uVar17 = (ulong)uVar15;
    iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
    *(undefined1 *)(*(long *)CONCAT44(extraout_var,iVar5) + 0x39) = 0;
    iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
    *(undefined4 *)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x3c) = 0;
    iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
    *(undefined4 *)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x40) = 0;
    iVar5 = 0;
    while( true ) {
      iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
      iVar6 = NaPetriNode::connectors(*(NaPetriNode **)CONCAT44(extraout_var_02,iVar6));
      if (iVar6 <= iVar5) break;
      if (bVar16 != 0) {
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        pcVar12 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_03,iVar6));
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        pNVar13 = NaPetriNode::connector(*(NaPetriNode **)CONCAT44(extraout_var_04,iVar6),iVar5);
        pcVar9 = NaPetriConnector::name(pNVar13);
        NaPrintLog("node \'%s\', connector \'%s\'\n",pcVar12,pcVar9);
      }
      iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
      pNVar13 = NaPetriNode::connector(*(NaPetriNode **)CONCAT44(extraout_var_05,iVar6),iVar5);
      (*pNVar13->_vptr_NaPetriConnector[4])(pNVar13);
      iVar5 = iVar5 + 1;
    }
    pNVar11 = this->dfTimeChart;
    uVar14 = uVar15 + 1;
    if (pNVar11 != (NaDataFile *)0x0) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar15);
      pcVar12 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_06,iVar5));
      (*pNVar11->_vptr_NaDataFile[9])(pNVar11,(ulong)uVar14,pcVar12);
    }
  }
  if (bVar16 != 0) {
    NaPrintLog("# net \'%s\', phase #1: open input data.\n",this->szName);
  }
  for (uVar14 = 0; (int)uVar14 < (this->pnaNet).nItems; uVar14 = uVar14 + 1) {
    if (bVar16 != 0) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      pcVar12 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_07,iVar5));
      NaPrintLog("node \'%s\'\n",pcVar12);
    }
    iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
    (**(code **)(**(long **)CONCAT44(extraout_var_08,iVar5) + 0x58))();
    if (bVar16 != 0) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      cVar4 = (**(code **)(**(long **)CONCAT44(extraout_var_09,iVar5) + 0x18))();
      if (cVar4 != '\0') {
        iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
        pNVar2 = *(NaPetriNode **)CONCAT44(extraout_var_10,iVar5);
        uVar15 = 0;
        while (uVar18 = uVar15, iVar5 = NaPetriNode::connectors(pNVar2), (int)uVar18 < iVar5) {
          pNVar13 = NaPetriNode::connector(pNVar2,uVar18);
          iVar5 = (*pNVar13->_vptr_NaPetriConnector[7])(pNVar13);
          uVar15 = uVar18 + 1;
          if (iVar5 == 1) {
            NaPrintLog("  #%d ",(ulong)uVar15);
            pNVar13 = NaPetriNode::connector(pNVar2,uVar18);
            (*pNVar13->_vptr_NaPetriConnector[3])(pNVar13);
          }
        }
      }
    }
  }
  if (bVar16 != 0) {
    NaPrintLog("# net \'%s\', phase #2: link connectors inside the node.\n",this->szName);
  }
  uVar14 = 1;
  uVar17 = 0xffffffffffffffff;
  do {
    if ((this->pnaNet).nItems < (int)uVar14) break;
    iVar5 = (int)uVar17;
    uVar17 = 0;
    NaPrintLog("## pass %u\n",(ulong)uVar14);
    for (uVar19 = 0; (int)uVar19 < (this->pnaNet).nItems; uVar19 = (ulong)((int)uVar19 + 1)) {
      iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar19);
      pNVar2 = *(NaPetriNode **)CONCAT44(extraout_var_11,iVar6);
      if (bVar16 != 0) {
        pcVar12 = NaPetriNode::name(pNVar2);
        NaPrintLog("node \'%s\'\n",pcVar12);
      }
      (*pNVar2->_vptr_NaPetriNode[0xc])(pNVar2);
      for (iVar6 = 0; iVar7 = NaPetriNode::connectors(pNVar2), iVar6 < iVar7; iVar6 = iVar6 + 1) {
        pNVar13 = NaPetriNode::connector(pNVar2,iVar6);
        iVar7 = (*pNVar13->_vptr_NaPetriConnector[8])(pNVar13);
        iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar7) + 0x30))
                          ((long *)CONCAT44(extraout_var_12,iVar7));
        uVar17 = (ulong)(uint)((int)uVar17 + iVar7);
      }
      if ((bVar16 != 0) && (iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2), (char)iVar6 != '\0')) {
        uVar15 = 0;
        while (iVar6 = NaPetriNode::connectors(pNVar2), (int)uVar15 < iVar6) {
          NaPrintLog("  #%d ",(ulong)(uVar15 + 1));
          pNVar13 = NaPetriNode::connector(pNVar2,uVar15);
          (*pNVar13->_vptr_NaPetriConnector[3])(pNVar13);
          uVar15 = uVar15 + 1;
        }
      }
    }
    NaPrintLog("## pass %u ==> total dim %u\n",(ulong)uVar14,uVar17);
    uVar14 = uVar14 + 1;
  } while (iVar5 != (int)uVar17);
  if (bVar16 != 0) {
    NaPrintLog("# net \'%s\', phase #3: open output data.\n",this->szName);
  }
  for (uVar14 = 0; (int)uVar14 < (this->pnaNet).nItems; uVar14 = uVar14 + 1) {
    if (bVar16 != 0) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      pcVar12 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_13,iVar5));
      NaPrintLog("node \'%s\'\n",pcVar12);
    }
    iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
    (**(code **)(**(long **)CONCAT44(extraout_var_14,iVar5) + 0x68))();
    if (bVar16 != 0) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      cVar4 = (**(code **)(**(long **)CONCAT44(extraout_var_15,iVar5) + 0x18))();
      if (cVar4 != '\0') {
        iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
        pNVar2 = *(NaPetriNode **)CONCAT44(extraout_var_16,iVar5);
        uVar15 = 0;
        while (uVar18 = uVar15, iVar5 = NaPetriNode::connectors(pNVar2), (int)uVar18 < iVar5) {
          pNVar13 = NaPetriNode::connector(pNVar2,uVar18);
          iVar5 = (*pNVar13->_vptr_NaPetriConnector[7])(pNVar13);
          uVar15 = uVar18 + 1;
          if (iVar5 == 0) {
            NaPrintLog("  #%d ",(ulong)uVar15);
            pNVar13 = NaPetriNode::connector(pNVar2,uVar18);
            (*pNVar13->_vptr_NaPetriConnector[3])(pNVar13);
          }
        }
      }
    }
  }
  if (bVar16 != 0) {
    NaPrintLog("# net \'%s\', phase #4: allocate resources.\n",this->szName);
  }
  for (uVar14 = 0; iVar5 = (this->pnaNet).nItems, (int)uVar14 < iVar5; uVar14 = uVar14 + 1) {
    iVar5 = 0;
    while( true ) {
      iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      iVar6 = NaPetriNode::connectors(*(NaPetriNode **)CONCAT44(extraout_var_17,iVar6));
      if (iVar6 <= iVar5) break;
      iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      pNVar13 = NaPetriNode::connector(*(NaPetriNode **)CONCAT44(extraout_var_18,iVar6),iVar5);
      (*pNVar13->_vptr_NaPetriConnector[5])(pNVar13);
      iVar5 = iVar5 + 1;
    }
  }
  for (uVar14 = 0; (int)uVar14 < iVar5; uVar14 = uVar14 + 1) {
    if (bVar16 != 0) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      pcVar12 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_19,iVar5));
      NaPrintLog("node \'%s\'\n",pcVar12);
    }
    iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
    (**(code **)(**(long **)CONCAT44(extraout_var_20,iVar5) + 0x70))();
    iVar5 = (this->pnaNet).nItems;
  }
  if (bVar16 != 0) {
    NaPrintLog("# net \'%s\', phase #5: verification.\n",this->szName);
  }
  bVar3 = false;
  for (uVar14 = 0; (int)uVar14 < (this->pnaNet).nItems; uVar14 = uVar14 + 1) {
    if (bVar16 != 0) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      pcVar12 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_21,iVar5));
      NaPrintLog("node \'%s\'\n",pcVar12);
    }
    iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
    cVar4 = (**(code **)(**(long **)CONCAT44(extraout_var_22,iVar5) + 0x78))();
    if (cVar4 == '\0') {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      pcVar12 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_23,iVar5));
      bVar3 = true;
      NaPrintLog("Node \'%s\' verification failed!\n",pcVar12);
    }
  }
  if (bVar16 == 0) {
    if (!bVar3) goto LAB_00145c08;
  }
  else {
    NaPrintLog("Petri net \'%s\' map:\n",this->szName);
    for (uVar14 = 0; (int)uVar14 < (this->pnaNet).nItems; uVar14 = uVar14 + 1) {
      iVar5 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar14);
      pNVar2 = *(NaPetriNode **)CONCAT44(extraout_var_24,iVar5);
      pcVar12 = NaPetriNode::name(pNVar2);
      NaPrintLog("* node \'%s\', connectors:\n",pcVar12);
      uVar15 = 0;
      while (iVar5 = NaPetriNode::connectors(pNVar2), (int)uVar15 < iVar5) {
        NaPrintLog("  #%d ",(ulong)(uVar15 + 1));
        pNVar13 = NaPetriNode::connector(pNVar2,uVar15);
        (*pNVar13->_vptr_NaPetriConnector[3])(pNVar13);
        uVar15 = uVar15 + 1;
      }
    }
    if (!bVar3) {
      NaPrintLog("# net \'%s\', phase #6: initialization.\n",this->szName);
LAB_00145c08:
      (*this->_vptr_NaPetriNet[4])(this,(ulong)bVar16);
      bUserBreak = false;
      sa.__sigaction_handler.sa_handler = user_break;
      sa.sa_flags = -0x80000000;
      sigaction(2,(sigaction *)&sa,(sigaction *)&sa_old);
      sigaction(0xf,(sigaction *)&sa,(sigaction *)&sa_old);
      sigaction(3,(sigaction *)&sa,(sigaction *)&sa_old);
      return true;
    }
  }
  return false;
}

Assistant:

bool
NaPetriNet::prepare (bool bDoPrintouts)
{
    int     iNode;
    bool    bFailed;

    if(bPrepPrintout)
      bDoPrintouts = bPrepPrintout;

    if(NULL != fpDig) {
	// Digraph is created already
	fprintf(fpDig, "}\n");
	fclose(fpDig);
	fpDig = NULL;
    }

    /* Create activation map file */
    if(bMapPrintout){
      char	*szMapName = new char[strlen(name()) + sizeof(".map")];
      sprintf(szMapName, "%s.map", name());
      fpMap = fopen(szMapName, "wt");
      if(NULL == fpMap){
	NaPrintLog("Failed to write activation map\n");
      }else{
	NaPrintLog("Activation map will be put to '%s'\n", szMapName);
      }
      delete[] szMapName;
    }

    // Do preparation phases

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #0: preparation.\n", name());
    }

    iPrevIndex = -1;
    dfTimeChart = NULL;
    if(bTimeChart){
        char    *fname = new char[strlen(name()) + sizeof(".grf")];
        sprintf(fname, "%s.grf", name());

        if(bDoPrintouts){
            NaPrintLog("Time chart is on -> %s.\n", fname);
        }

        dfTimeChart = OpenOutputDataFile(fname);
        if(NULL == dfTimeChart){
            NaPrintLog("time chart file opening failed.\n");
        }else{
	    const char    *msg = "Time chart for petri network '%s'";
            char    *title = new char[strlen(msg) + strlen(name())];
            sprintf(title, msg, name());
            dfTimeChart->SetVarName(0, "*TIME*");
	    delete[] title;
        }

	delete[] fname;
    }

    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        // Disallow changes of node parameters
        pnaNet[iNode]->bTunable = false;

        // Setup 0 past calls for node activity
        pnaNet[iNode]->nCalls = 0;

        // Setup 0 past activations of node
        pnaNet[iNode]->nActivations = 0;

        // Need to initialize connectors
        int iCn;
        for(iCn = 0; iCn < pnaNet[iNode]->connectors(); ++iCn){
            if(bDoPrintouts){
                NaPrintLog("node '%s', connector '%s'\n",
                           pnaNet[iNode]->name(),
                           pnaNet[iNode]->connector(iCn)->name());
            }
            pnaNet[iNode]->connector(iCn)->init();
        }

        // Add node to time chart
        if(NULL != dfTimeChart){
            dfTimeChart->SetVarName(1 + iNode, pnaNet[iNode]->name());
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #1: open input data.\n", name());
    }

    // 1. Open input data (pure output nodes) and get their dimensions
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->open_input_data();

	    /* describe only output connectors */
	    if(bDoPrintouts && pnaNet[iNode]->is_verbose()){
	      int	iCn;
	      NaPetriNode	&node = *pnaNet[iNode];

	      for(iCn = 0; iCn < node.connectors(); ++iCn){
		if(pckOutput == node.connector(iCn)->kind()){
		  NaPrintLog("  #%d ", iCn + 1);
		  node.connector(iCn)->describe();
		}
	      }
	    }
        }catch(NaException exCode){
            NaPrintLog("Open input data phase (#1): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #2: link connectors inside the node.\n",
                   name());
    }

    // 2. Link connectors inside the node
    unsigned nPrevDim = (unsigned)(-1);
    // Not more passes than number of nodes
    for(int iPass = 1; iPass <= pnaNet.count(); ++iPass){
      NaPrintLog("## pass %u\n", iPass);

      unsigned nTotalDim = 0;
      for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
	  NaPetriNode	&node = *pnaNet[iNode];

            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", node.name());
            }
            node.relate_connectors();

	    int	iCn;
	    for(iCn = 0; iCn < node.connectors(); ++iCn){
	      nTotalDim += node.connector(iCn)->data().dim();
	    }

	    /* describe all connectors */
	    if(bDoPrintouts && node.is_verbose()){
	      for(iCn = 0; iCn < node.connectors(); ++iCn){
		NaPrintLog("  #%d ", iCn + 1);
		node.connector(iCn)->describe();
	      }
	    }

        }catch(NaException exCode){
            NaPrintLog("Link connectors phase (#2): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
      } // for nodes

      NaPrintLog("## pass %u ==> total dim %u\n", iPass, nTotalDim);

      // Iterate until dimensions became stable
      if(nPrevDim == nTotalDim)
	break;

      nPrevDim = nTotalDim;

    } // for passes

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #3: open output data.\n", name());
    }

    // 3. Open output data (pure input nodes) and set their dimensions
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->open_output_data();

	    /* describe only input connectors */
	    if(bDoPrintouts && pnaNet[iNode]->is_verbose()){
	      int	iCn;
	      NaPetriNode	&node = *pnaNet[iNode];

	      for(iCn = 0; iCn < node.connectors(); ++iCn){
		if(pckInput == node.connector(iCn)->kind()){
		  NaPrintLog("  #%d ", iCn + 1);
		  node.connector(iCn)->describe();
		}
	      }
	    }
        }catch(NaException exCode){
            NaPrintLog("Open output data phase (#3): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #4: allocate resources.\n", name());
    }

    // Call dim_ready() for each connector
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        // Need to setup connections
        int iCn;
        for(iCn = 0; iCn < pnaNet[iNode]->connectors(); ++iCn){
	  try{
            pnaNet[iNode]->connector(iCn)->dim_ready();
	  }catch(NaException exCode){
            NaPrintLog("Failure at %s.%s.%s.dim_ready().\n"
                       "Caused by exception: %s\n",
		       name(), pnaNet[iNode]->name(),
		       pnaNet[iNode]->connector(iCn)->name(),
		       NaExceptionMsg(exCode));
	  }
        }
    }

    // 4. Allocate resources for internal usage
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->allocate_resources();
        }catch(NaException exCode){
            NaPrintLog("Allocate resources phase (#4): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #5: verification.\n", name());
    }

    // 5. Verification to be sure all is OK (true)
    bFailed = false;
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            if(!pnaNet[iNode]->verify()){
                bFailed = bFailed || true;
                NaPrintLog("Node '%s' verification failed!\n",
                           pnaNet[iNode]->name());
            }
        }catch(NaException exCode){
            bFailed = bFailed || true;
            NaPrintLog("Verification phase (#5): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    if(bDoPrintouts){
        NaPrintLog("Petri net '%s' map:\n", name());
        for(iNode = 0; iNode < pnaNet.count(); ++iNode){
            int         iCn;
            NaPetriNode &node = *pnaNet[iNode];

            NaPrintLog("* node '%s', connectors:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
                NaPrintLog("  #%d ", iCn + 1);
                node.connector(iCn)->describe();
            }
        }
    }

    if(bFailed){
        return false;
    }

    if(bDoPrintouts){
        NaPrintLog("# net '%s', phase #6: initialization.\n", name());
    }

    // 6. Initialize node activity and setup starter flag if needed
    initialize(bDoPrintouts);

#if defined(unix)
    // Prepare value of handling user break
    bUserBreak = false;

    // Register the signal handler
    struct sigaction	sa, sa_old;
    sa.sa_handler = user_break;
    sa.sa_flags = SA_ONESHOT;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
#endif /* unix */

    return true;
}